

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  bool bVar1;
  Which WVar2;
  uint32_t uVar3;
  StringPtr local_190;
  Reader local_180;
  Reader local_150;
  Reader local_120;
  Reader local_f0;
  undefined1 local_c0 [8];
  Reader fieldDecl;
  Fault f;
  Reader local_78;
  ArrayPtr<const_char> local_48;
  undefined1 local_31;
  anon_union_8_2_6a1c0e2c_for_MemberInfo_21 aStack_30;
  bool isInUnion_local;
  StructOrGroup *fieldScope_local;
  Reader *decl_local;
  MemberInfo *pMStack_18;
  uint codeOrder_local;
  MemberInfo *parent_local;
  MemberInfo *this_local;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  local_31 = isInUnion;
  aStack_30 = (anon_union_8_2_6a1c0e2c_for_MemberInfo_21)fieldScope;
  fieldScope_local = (StructOrGroup *)decl;
  decl_local._4_4_ = codeOrder;
  pMStack_18 = parent;
  parent_local = this;
  Declaration::Reader::getName(&local_78,decl);
  local_48 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_78);
  (this->name).content.ptr = local_48.ptr;
  (this->name).content.size_ = local_48.size_;
  Declaration::Reader::getId(&this->declId,(Reader *)fieldScope_local);
  this->declKind = FIELD;
  this->isParam = false;
  this->hasDefaultValue = false;
  Expression::Reader::Reader(&this->fieldType);
  Expression::Reader::Reader(&this->fieldDefaultValue);
  Declaration::Reader::getAnnotations(&this->declAnnotations,(Reader *)fieldScope_local);
  uVar3 = Declaration::Reader::getStartByte((Reader *)fieldScope_local);
  this->startByte = uVar3;
  uVar3 = Declaration::Reader::getEndByte((Reader *)fieldScope_local);
  this->endByte = uVar3;
  kj::Maybe<capnp::Text::Reader>::Maybe(&this->docComment,(void *)0x0);
  kj::Maybe<capnp::schema::Field::Builder>::Maybe(&this->schema);
  capnp::schema::Node::Builder::Builder(&this->node,(void *)0x0);
  capnp::schema::Node::SourceInfo::Builder::Builder(&this->sourceInfo,(void *)0x0);
  this->field_21 = aStack_30;
  WVar2 = Declaration::Reader::which((Reader *)fieldScope_local);
  if (WVar2 != FIELD) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&fieldDecl._reader.nestingLimit,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x73d,FAILED,"decl.which() == Declaration::FIELD","");
    kj::_::Debug::Fault::fatal((Fault *)&fieldDecl._reader.nestingLimit);
  }
  Declaration::Reader::getField((Reader *)local_c0,(Reader *)fieldScope_local);
  Declaration::Field::Reader::getType(&local_f0,(Reader *)local_c0);
  (this->fieldType)._reader.dataSize = local_f0._reader.dataSize;
  (this->fieldType)._reader.pointerCount = local_f0._reader.pointerCount;
  *(undefined2 *)&(this->fieldType)._reader.field_0x26 = local_f0._reader._38_2_;
  (this->fieldType)._reader.nestingLimit = local_f0._reader.nestingLimit;
  *(undefined4 *)&(this->fieldType)._reader.field_0x2c = local_f0._reader._44_4_;
  (this->fieldType)._reader.data = local_f0._reader.data;
  (this->fieldType)._reader.pointers = local_f0._reader.pointers;
  (this->fieldType)._reader.segment = local_f0._reader.segment;
  (this->fieldType)._reader.capTable = local_f0._reader.capTable;
  Declaration::Field::Reader::getDefaultValue(&local_120,(Reader *)local_c0);
  bVar1 = Declaration::Field::DefaultValue::Reader::isValue(&local_120);
  if (bVar1) {
    this->hasDefaultValue = true;
    Declaration::Field::Reader::getDefaultValue(&local_180,(Reader *)local_c0);
    Declaration::Field::DefaultValue::Reader::getValue(&local_150,&local_180);
    memcpy(&this->fieldDefaultValue,&local_150,0x30);
  }
  bVar1 = Declaration::Reader::hasDocComment((Reader *)fieldScope_local);
  if (bVar1) {
    local_190.content =
         (ArrayPtr<const_char>)Declaration::Reader::getDocComment((Reader *)fieldScope_local);
    kj::Maybe<capnp::Text::Reader>::operator=(&this->docComment,(Reader *)&local_190);
  }
  return;
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(Declaration::FIELD),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      KJ_REQUIRE(decl.which() == Declaration::FIELD);
      auto fieldDecl = decl.getField();
      fieldType = fieldDecl.getType();
      if (fieldDecl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = fieldDecl.getDefaultValue().getValue();
      }
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }